

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

void __thiscall
Js::FunctionExecutionStateMachine::SetFullJitThreshold
          (FunctionExecutionStateMachine *this,uint16 newFullJitThreshold,bool skipSimpleJit)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  bool bVar4;
  bool bVar5;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar6;
  FunctionBody *pFVar7;
  Type *local_50;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  bool local_3a;
  bool local_39;
  undefined1 auStack_28 [5];
  bool fullyScaled;
  bool doInterpreterProfile;
  bool doSimpleJit;
  anon_class_16_2_023ad54b ScaleLimit;
  int scale;
  bool skipSimpleJit_local;
  uint16 newFullJitThreshold_local;
  FunctionExecutionStateMachine *this_local;
  
  ScaleLimit.this._5_1_ = skipSimpleJit;
  ScaleLimit.this._6_2_ = newFullJitThreshold;
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x158,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  EVar3 = GetExecutionMode(this);
  if (EVar3 == FullJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x159,"(GetExecutionMode() != ExecutionMode::FullJit)",
                                "GetExecutionMode() != ExecutionMode::FullJit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ScaleLimit.this._0_4_ = (uint)ScaleLimit.this._6_2_ - (uint)this->fullJitThreshold;
  if ((int)ScaleLimit.this == 0) {
    VerifyExecutionModeLimits(this);
    return;
  }
  this->fullJitThreshold = ScaleLimit.this._6_2_;
  _auStack_28 = &ScaleLimit.this;
  ScaleLimit.scale = (int *)this;
  pFVar7 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  bVar2 = FunctionBody::DoSimpleJit(pFVar7);
  pFVar7 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  bVar4 = FunctionBody::DoInterpreterProfile(pFVar7);
  if (((DAT_01eafdac & 1) != 0) && (bVar2)) {
    bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                      ((anon_class_16_2_023ad54b *)auStack_28,&this->simpleJitLimit);
    local_39 = true;
    if (bVar5) goto LAB_00a4e824;
  }
  if (bVar4) {
    pFVar7 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    bVar5 = FunctionBody::DoInterpreterAutoProfile(pFVar7);
    if (bVar5) {
      bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)auStack_28,
                         &this->autoProfilingInterpreter1Limit);
      local_39 = true;
      if (bVar5) goto LAB_00a4e824;
      bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)auStack_28,
                         &this->autoProfilingInterpreter0Limit);
      goto joined_r0x00a4e74d;
    }
  }
  else {
    bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                      ((anon_class_16_2_023ad54b *)auStack_28,&this->interpreterLimit);
joined_r0x00a4e74d:
    local_39 = true;
    if (bVar5) goto LAB_00a4e824;
  }
  if ((DAT_01eafdac & 1) == 0) {
    if (bVar4) {
      bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)auStack_28,&this->profilingInterpreter0Limit);
      local_3d = true;
      if (!bVar5) goto LAB_00a4e7d0;
    }
    else {
LAB_00a4e7d0:
      if (bVar2) {
        bVar2 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                          ((anon_class_16_2_023ad54b *)auStack_28,&this->simpleJitLimit);
        local_3d = true;
        if (bVar2) goto LAB_00a4e818;
      }
      local_3e = false;
      if (bVar4) {
        local_3e = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                             ((anon_class_16_2_023ad54b *)auStack_28,
                              &this->profilingInterpreter1Limit);
      }
      local_3d = local_3e;
    }
LAB_00a4e818:
    local_3c = local_3d;
  }
  else {
    local_3a = false;
    if (bVar4) {
      bVar2 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)auStack_28,&this->profilingInterpreter1Limit);
      local_3b = true;
      if (!bVar2) {
        local_3b = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                             ((anon_class_16_2_023ad54b *)auStack_28,
                              &this->profilingInterpreter0Limit);
      }
      local_3a = local_3b;
    }
    local_3c = local_3a;
  }
  local_39 = local_3c;
LAB_00a4e824:
  if (local_39 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x199,"(fullyScaled)","fullyScaled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((int)ScaleLimit.this != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x19a,"(scale == 0)","scale == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  EVar3 = GetExecutionMode(this);
  if (EVar3 != SimpleJit) {
    bVar2 = IsInterpreterExecutionMode(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                  ,0x19e,"(IsInterpreterExecutionMode())",
                                  "IsInterpreterExecutionMode()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if ((this->simpleJitLimit != 0) &&
       (((ScaleLimit.this._5_1_ & 1) != 0 || (this->simpleJitLimit < 0x10)))) {
      pFVar7 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
      pFVar7 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,SimpleJitPhase,sourceContextId,functionId);
      if (!bVar2) {
        if ((DAT_01eafdac & 1) == 0) {
          local_50 = &this->profilingInterpreter1Limit;
        }
        else {
          local_50 = &this->autoProfilingInterpreter1Limit;
        }
        *local_50 = *local_50 + this->simpleJitLimit;
        this->simpleJitLimit = 0;
        TryTransitionToNextInterpreterExecutionMode(this);
      }
    }
  }
  VerifyExecutionModeLimits(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetFullJitThreshold(const uint16 newFullJitThreshold, const bool skipSimpleJit)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() != ExecutionMode::FullJit);

        int scale = newFullJitThreshold - fullJitThreshold;
        if (scale == 0)
        {
            VerifyExecutionModeLimits();
            return;
        }
        fullJitThreshold = newFullJitThreshold;

        const auto ScaleLimit = [&](uint16 &limit) -> bool
        {
            Assert(scale != 0);
            const int limitScale = max(-static_cast<int>(limit), scale);
            const int newLimit = limit + limitScale;
            Assert(static_cast<int>(static_cast<uint16>(newLimit)) == newLimit);
            limit = static_cast<uint16>(newLimit);
            scale -= limitScale;
            Assert(limit == 0 || scale == 0);

            if (&limit == &simpleJitLimit)
            {
                FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
                if (owner->GetDefaultFunctionEntryPointInfo() == simpleJitEntryPointInfo)
                {
                    Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
                    const int newSimpleJitCallCount = max(0, (int)simpleJitEntryPointInfo->callsCount + limitScale);
                    Assert(static_cast<int>(static_cast<uint16>(newSimpleJitCallCount)) == newSimpleJitCallCount);
                    SetSimpleJitCallCount(static_cast<uint16>(newSimpleJitCallCount));
                }
            }

            return scale == 0;
        };

        /*
        Determine which execution mode's limit scales with the full JIT threshold, in order of preference:
        - New simple JIT
        - Auto-profiling interpreter 1
        - Auto-profiling interpreter 0
        - Interpreter
        - Profiling interpreter 0 (when using old simple JIT)
        - Old simple JIT
        - Profiling interpreter 1
        - Profiling interpreter 0 (when using new simple JIT)
        */
        const bool doSimpleJit = owner->DoSimpleJit();
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        const bool fullyScaled =
            (CONFIG_FLAG(NewSimpleJit) && doSimpleJit && ScaleLimit(simpleJitLimit)) ||
            (
                doInterpreterProfile
                ? owner->DoInterpreterAutoProfile() &&
                (ScaleLimit(autoProfilingInterpreter1Limit) || ScaleLimit(autoProfilingInterpreter0Limit))
                : ScaleLimit(interpreterLimit)
                ) ||
                (
                    CONFIG_FLAG(NewSimpleJit)
                    ? doInterpreterProfile &&
                    (ScaleLimit(profilingInterpreter1Limit) || ScaleLimit(profilingInterpreter0Limit))
                    : (doInterpreterProfile && ScaleLimit(profilingInterpreter0Limit)) ||
                    (doSimpleJit && ScaleLimit(simpleJitLimit)) ||
                    (doInterpreterProfile && ScaleLimit(profilingInterpreter1Limit))
                    );
        Assert(fullyScaled);
        Assert(scale == 0);

        if (GetExecutionMode() != ExecutionMode::SimpleJit)
        {
            Assert(IsInterpreterExecutionMode());
            if (simpleJitLimit != 0 &&
                (skipSimpleJit || simpleJitLimit < DEFAULT_CONFIG_MinSimpleJitIterations) &&
                !PHASE_FORCE(Phase::SimpleJitPhase, owner))
            {
                // Simple JIT code has not yet been generated, and was either requested to be skipped, or the limit was scaled
                // down too much. Skip simple JIT by moving any remaining iterations to an equivalent interpreter execution
                // mode.
                (CONFIG_FLAG(NewSimpleJit) ? autoProfilingInterpreter1Limit : profilingInterpreter1Limit) += simpleJitLimit;
                simpleJitLimit = 0;
                TryTransitionToNextInterpreterExecutionMode();
            }
        }

        VerifyExecutionModeLimits();
    }